

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O1

void idct32_low1_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  __m256i alVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  
  iVar5 = 1 << ((char)bit - 1U & 0x1f);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + (long)bit * 0x100 + 0x1e0);
  auVar6._4_4_ = uVar1;
  auVar6._0_4_ = uVar1;
  auVar6._8_4_ = uVar1;
  auVar6._12_4_ = uVar1;
  auVar6._16_4_ = uVar1;
  auVar6._20_4_ = uVar1;
  auVar6._24_4_ = uVar1;
  auVar6._28_4_ = uVar1;
  auVar6 = vpmulld_avx2(auVar6,(undefined1  [32])*in);
  auVar8._4_4_ = iVar5;
  auVar8._0_4_ = iVar5;
  auVar8._8_4_ = iVar5;
  auVar8._12_4_ = iVar5;
  auVar8._16_4_ = iVar5;
  auVar8._20_4_ = iVar5;
  auVar8._24_4_ = iVar5;
  auVar8._28_4_ = iVar5;
  auVar6 = vpaddd_avx2(auVar6,auVar8);
  iVar3 = bd + 6 + (uint)(do_cols == 0) * 2;
  iVar5 = 0x8000;
  if (0xf < iVar3) {
    iVar5 = 1 << ((char)iVar3 - 1U & 0x1f);
  }
  auVar6 = vpsrad_avx2(auVar6,ZEXT416((uint)bit));
  if (do_cols == 0) {
    iVar5 = 10;
    if (10 < bd) {
      iVar5 = bd;
    }
    iVar3 = (1 << ((byte)out_shift & 0x1f)) >> 1;
    iVar4 = 0x20 << ((byte)iVar5 & 0x1f);
    auVar10._4_4_ = iVar3;
    auVar10._0_4_ = iVar3;
    auVar10._8_4_ = iVar3;
    auVar10._12_4_ = iVar3;
    auVar10._16_4_ = iVar3;
    auVar10._20_4_ = iVar3;
    auVar10._24_4_ = iVar3;
    auVar10._28_4_ = iVar3;
    iVar5 = -iVar4;
    auVar7._4_4_ = iVar5;
    auVar7._0_4_ = iVar5;
    auVar7._8_4_ = iVar5;
    auVar7._12_4_ = iVar5;
    auVar7._16_4_ = iVar5;
    auVar7._20_4_ = iVar5;
    auVar7._24_4_ = iVar5;
    auVar7._28_4_ = iVar5;
    iVar4 = iVar4 + -1;
    auVar9._4_4_ = iVar4;
    auVar9._0_4_ = iVar4;
    auVar9._8_4_ = iVar4;
    auVar9._12_4_ = iVar4;
    auVar9._16_4_ = iVar4;
    auVar9._20_4_ = iVar4;
    auVar9._24_4_ = iVar4;
    auVar9._28_4_ = iVar4;
    auVar6 = vpaddd_avx2(auVar6,auVar10);
    auVar6 = vpsrad_avx2(auVar6,ZEXT416((uint)out_shift));
  }
  else {
    iVar3 = -iVar5;
    iVar5 = iVar5 + -1;
    auVar7._4_4_ = iVar3;
    auVar7._0_4_ = iVar3;
    auVar7._8_4_ = iVar3;
    auVar7._12_4_ = iVar3;
    auVar7._16_4_ = iVar3;
    auVar7._20_4_ = iVar3;
    auVar7._24_4_ = iVar3;
    auVar7._28_4_ = iVar3;
    auVar9._4_4_ = iVar5;
    auVar9._0_4_ = iVar5;
    auVar9._8_4_ = iVar5;
    auVar9._12_4_ = iVar5;
    auVar9._16_4_ = iVar5;
    auVar9._20_4_ = iVar5;
    auVar9._24_4_ = iVar5;
    auVar9._28_4_ = iVar5;
  }
  auVar6 = vpmaxsd_avx2(auVar6,auVar7);
  alVar2 = (__m256i)vpminsd_avx2(auVar6,auVar9);
  *out = alVar2;
  out[1] = alVar2;
  out[2] = alVar2;
  out[3] = alVar2;
  out[4] = alVar2;
  out[5] = alVar2;
  out[6] = alVar2;
  out[7] = alVar2;
  out[8] = alVar2;
  out[9] = alVar2;
  out[10] = alVar2;
  out[0xb] = alVar2;
  out[0xc] = alVar2;
  out[0xd] = alVar2;
  out[0xe] = alVar2;
  out[0xf] = alVar2;
  out[0x10] = alVar2;
  out[0x11] = alVar2;
  out[0x12] = alVar2;
  out[0x13] = alVar2;
  out[0x14] = alVar2;
  out[0x15] = alVar2;
  out[0x16] = alVar2;
  out[0x17] = alVar2;
  out[0x18] = alVar2;
  out[0x19] = alVar2;
  out[0x1a] = alVar2;
  out[0x1b] = alVar2;
  out[0x1c] = alVar2;
  out[0x1d] = alVar2;
  out[0x1e] = alVar2;
  out[0x1f] = alVar2;
  return;
}

Assistant:

static void idct32_low1_avx2(__m256i *in, __m256i *out, int bit, int do_cols,
                             int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i rounding = _mm256_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  __m256i clamp_lo = _mm256_set1_epi32(-(1 << (log_range - 1)));
  __m256i clamp_hi = _mm256_set1_epi32((1 << (log_range - 1)) - 1);
  __m256i x;
  // stage 0
  // stage 1
  // stage 2
  // stage 3
  // stage 4
  // stage 5
  x = _mm256_mullo_epi32(in[0], cospi32);
  x = _mm256_add_epi32(x, rounding);
  x = _mm256_srai_epi32(x, bit);

  // stage 6
  // stage 7
  // stage 8
  // stage 9
  if (!do_cols) {
    const int log_range_out = AOMMAX(16, bd + 6);
    __m256i offset = _mm256_set1_epi32((1 << out_shift) >> 1);
    clamp_lo = _mm256_set1_epi32(-(1 << (log_range_out - 1)));
    clamp_hi = _mm256_set1_epi32((1 << (log_range_out - 1)) - 1);
    x = _mm256_add_epi32(offset, x);
    x = _mm256_sra_epi32(x, _mm_cvtsi32_si128(out_shift));
  }
  x = _mm256_max_epi32(x, clamp_lo);
  x = _mm256_min_epi32(x, clamp_hi);
  out[0] = x;
  out[1] = x;
  out[2] = x;
  out[3] = x;
  out[4] = x;
  out[5] = x;
  out[6] = x;
  out[7] = x;
  out[8] = x;
  out[9] = x;
  out[10] = x;
  out[11] = x;
  out[12] = x;
  out[13] = x;
  out[14] = x;
  out[15] = x;
  out[16] = x;
  out[17] = x;
  out[18] = x;
  out[19] = x;
  out[20] = x;
  out[21] = x;
  out[22] = x;
  out[23] = x;
  out[24] = x;
  out[25] = x;
  out[26] = x;
  out[27] = x;
  out[28] = x;
  out[29] = x;
  out[30] = x;
  out[31] = x;
}